

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall olc::Renderer_OGL10::UpdateViewport(Renderer_OGL10 *this,vi2d *pos,vi2d *size)

{
  vi2d *size_local;
  vi2d *pos_local;
  Renderer_OGL10 *this_local;
  
  glViewport(pos->x,pos->y,size->x,size->y);
  return;
}

Assistant:

void UpdateViewport(const olc::vi2d &pos, const olc::vi2d &size) override
		{
#if defined(OLC_PLATFORM_GLUT)
			if (!mFullScreen)
				glutReshapeWindow(size.x, size.y);
#else
			glViewport(pos.x, pos.y, size.x, size.y);
#endif
		}